

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O3

QSupportedWritingSystems __thiscall
QPlatformFontDatabase::writingSystemsFromTrueTypeBits
          (QPlatformFontDatabase *this,quint32 *unicodeRange,quint32 *codePageRange)

{
  byte bVar1;
  bool bVar2;
  pointer pbVar3;
  uint uVar4;
  quint8 (*paqVar5) [2];
  int i;
  long lVar6;
  long in_FS_OFFSET;
  QSupportedWritingSystems QStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QPlatformFontDatabase = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  QSupportedWritingSystems::QSupportedWritingSystems((QSupportedWritingSystems *)this);
  paqVar5 = requiredUnicodeBits;
  lVar6 = 0;
  bVar2 = false;
  do {
    bVar1 = (*paqVar5)[0];
    if ((bVar1 != 0x7e) && ((unicodeRange[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) != 0)) {
      QSupportedWritingSystems::detach((QSupportedWritingSystems *)this);
      pbVar3 = QList<bool>::data((QList<bool> *)(this->_vptr_QPlatformFontDatabase + 1));
      pbVar3[lVar6] = true;
      bVar2 = true;
    }
    lVar6 = lVar6 + 1;
    paqVar5 = paqVar5 + 1;
  } while (lVar6 != 0x22);
  uVar4 = *codePageRange;
  if ((uVar4 & 0x93) != 0) {
    QSupportedWritingSystems::detach((QSupportedWritingSystems *)this);
    pbVar3 = QList<bool>::data((QList<bool> *)(this->_vptr_QPlatformFontDatabase + 1));
    pbVar3[1] = true;
    uVar4 = *codePageRange;
    bVar2 = true;
  }
  if ((uVar4 & 4) != 0) {
    QSupportedWritingSystems::detach((QSupportedWritingSystems *)this);
    pbVar3 = QList<bool>::data((QList<bool> *)(this->_vptr_QPlatformFontDatabase + 1));
    pbVar3[3] = true;
    uVar4 = *codePageRange;
    bVar2 = true;
  }
  if ((uVar4 & 8) != 0) {
    QSupportedWritingSystems::detach((QSupportedWritingSystems *)this);
    pbVar3 = QList<bool>::data((QList<bool> *)(this->_vptr_QPlatformFontDatabase + 1));
    pbVar3[2] = true;
    uVar4 = *codePageRange;
    bVar2 = true;
  }
  if ((uVar4 & 0x20) != 0) {
    QSupportedWritingSystems::detach((QSupportedWritingSystems *)this);
    pbVar3 = QList<bool>::data((QList<bool> *)(this->_vptr_QPlatformFontDatabase + 1));
    pbVar3[5] = true;
    uVar4 = *codePageRange;
    bVar2 = true;
  }
  if ((uVar4 & 0x40) != 0) {
    QSupportedWritingSystems::detach((QSupportedWritingSystems *)this);
    pbVar3 = QList<bool>::data((QList<bool> *)(this->_vptr_QPlatformFontDatabase + 1));
    pbVar3[6] = true;
    uVar4 = *codePageRange;
    bVar2 = true;
  }
  if ((uVar4 >> 0x10 & 1) != 0) {
    QSupportedWritingSystems::detach((QSupportedWritingSystems *)this);
    pbVar3 = QList<bool>::data((QList<bool> *)(this->_vptr_QPlatformFontDatabase + 1));
    pbVar3[0x13] = true;
    uVar4 = *codePageRange;
    bVar2 = true;
  }
  if ((uVar4 >> 8 & 1) != 0) {
    QSupportedWritingSystems::detach((QSupportedWritingSystems *)this);
    pbVar3 = QList<bool>::data((QList<bool> *)(this->_vptr_QPlatformFontDatabase + 1));
    pbVar3[0x1d] = true;
    uVar4 = *codePageRange;
    bVar2 = true;
  }
  if ((uVar4 >> 0x12 & 1) != 0) {
    QSupportedWritingSystems::detach((QSupportedWritingSystems *)this);
    pbVar3 = QList<bool>::data((QList<bool> *)(this->_vptr_QPlatformFontDatabase + 1));
    pbVar3[0x19] = true;
    uVar4 = *codePageRange;
    bVar2 = true;
  }
  if ((uVar4 >> 0x14 & 1) != 0) {
    QSupportedWritingSystems::detach((QSupportedWritingSystems *)this);
    pbVar3 = QList<bool>::data((QList<bool> *)(this->_vptr_QPlatformFontDatabase + 1));
    pbVar3[0x1a] = true;
    uVar4 = *codePageRange;
    bVar2 = true;
  }
  if ((uVar4 >> 0x11 & 1) != 0) {
    QSupportedWritingSystems::detach((QSupportedWritingSystems *)this);
    pbVar3 = QList<bool>::data((QList<bool> *)(this->_vptr_QPlatformFontDatabase + 1));
    pbVar3[0x1b] = true;
    uVar4 = *codePageRange;
    bVar2 = true;
  }
  if ((uVar4 & 0x280000) == 0) {
    if ((int)uVar4 < 0) goto LAB_004b3620;
    if (bVar2) goto LAB_004b3656;
  }
  else {
    QSupportedWritingSystems::detach((QSupportedWritingSystems *)this);
    pbVar3 = QList<bool>::data((QList<bool> *)(this->_vptr_QPlatformFontDatabase + 1));
    pbVar3[0x1c] = true;
    if (-1 < (int)*codePageRange) goto LAB_004b3656;
LAB_004b3620:
    QSupportedWritingSystems::QSupportedWritingSystems(&QStack_38);
    QSupportedWritingSystems::operator=((QSupportedWritingSystems *)this,&QStack_38);
    QSupportedWritingSystems::~QSupportedWritingSystems(&QStack_38);
  }
  QSupportedWritingSystems::detach((QSupportedWritingSystems *)this);
  pbVar3 = QList<bool>::data((QList<bool> *)(this->_vptr_QPlatformFontDatabase + 1));
  pbVar3[0x1e] = true;
LAB_004b3656:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QSupportedWritingSystems)(QWritingSystemsPrivate *)this;
}

Assistant:

QSupportedWritingSystems QPlatformFontDatabase::writingSystemsFromTrueTypeBits(quint32 unicodeRange[4], quint32 codePageRange[2])
{
    QSupportedWritingSystems writingSystems;

    bool hasScript = false;
    for (int i = 0; i < QFontDatabase::WritingSystemsCount; ++i) {
        int bit = requiredUnicodeBits[i][0];
        int index = bit/32;
        int flag = 1 << (bit&31);
        if (bit != 126 && (unicodeRange[index] & flag)) {
            bit = requiredUnicodeBits[i][1];
            index = bit/32;

            flag = 1 << (bit&31);
            if (bit == 127 || (unicodeRange[index] & flag)) {
                writingSystems.setSupported(QFontDatabase::WritingSystem(i));
                hasScript = true;
                // qDebug("font %s: index=%d, flag=%8x supports script %d", familyName.latin1(), index, flag, i);
            }
        }
    }
    if (codePageRange[0] & ((1 << Latin1CsbBit) | (1 << CentralEuropeCsbBit) | (1 << TurkishCsbBit) | (1 << BalticCsbBit))) {
        writingSystems.setSupported(QFontDatabase::Latin);
        hasScript = true;
        //qDebug("font %s supports Latin", familyName.latin1());
    }
    if (codePageRange[0] & (1 << CyrillicCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Cyrillic);
        hasScript = true;
        //qDebug("font %s supports Cyrillic", familyName.latin1());
    }
    if (codePageRange[0] & (1 << GreekCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Greek);
        hasScript = true;
        //qDebug("font %s supports Greek", familyName.latin1());
    }
    if (codePageRange[0] & (1 << HebrewCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Hebrew);
        hasScript = true;
        //qDebug("font %s supports Hebrew", familyName.latin1());
    }
    if (codePageRange[0] & (1 << ArabicCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Arabic);
        hasScript = true;
        //qDebug("font %s supports Arabic", familyName.latin1());
    }
    if (codePageRange[0] & (1 << ThaiCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Thai);
        hasScript = true;
        //qDebug("font %s supports Thai", familyName.latin1());
    }
    if (codePageRange[0] & (1 << VietnameseCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Vietnamese);
        hasScript = true;
        //qDebug("font %s supports Vietnamese", familyName.latin1());
    }
    if (codePageRange[0] & (1 << SimplifiedChineseCsbBit)) {
        writingSystems.setSupported(QFontDatabase::SimplifiedChinese);
        hasScript = true;
        //qDebug("font %s supports Simplified Chinese", familyName.latin1());
    }
    if (codePageRange[0] & (1 << TraditionalChineseCsbBit)) {
        writingSystems.setSupported(QFontDatabase::TraditionalChinese);
        hasScript = true;
        //qDebug("font %s supports Traditional Chinese", familyName.latin1());
    }
    if (codePageRange[0] & (1 << JapaneseCsbBit)) {
        writingSystems.setSupported(QFontDatabase::Japanese);
        hasScript = true;
        //qDebug("font %s supports Japanese", familyName.latin1());
    }
    if (codePageRange[0] & ((1 << KoreanCsbBit) | (1 << KoreanJohabCsbBit))) {
        writingSystems.setSupported(QFontDatabase::Korean);
        hasScript = true;
        //qDebug("font %s supports Korean", familyName.latin1());
    }
    if (codePageRange[0] & (1U << SymbolCsbBit)) {
        writingSystems = QSupportedWritingSystems();
        hasScript = false;
    }

    if (!hasScript)
        writingSystems.setSupported(QFontDatabase::Symbol);

    return writingSystems;
}